

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall astar::Map::Map(Map *this,int w,int h)

{
  int iVar1;
  int iVar2;
  int local_70;
  int local_6c;
  allocator<std::vector<int,_std::allocator<int>_>_> local_5d [16];
  allocator<int> local_4d;
  value_type_conflict local_4c;
  vector<int,_std::allocator<int>_> local_48;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_30;
  int local_18;
  int local_14;
  int h_local;
  int w_local;
  Map *this_local;
  
  local_18 = h;
  local_14 = w;
  _h_local = this;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->map);
  this->n = local_18;
  this->m = local_14;
  if (this->n < 1) {
    local_6c = 0;
  }
  else {
    local_6c = this->n;
  }
  this->n = local_6c;
  if (this->m < 1) {
    local_70 = 0;
  }
  else {
    local_70 = this->m;
  }
  this->m = local_70;
  iVar1 = this->n;
  iVar2 = this->m;
  local_4c = 0;
  std::allocator<int>::allocator(&local_4d);
  std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)iVar2,&local_4c,&local_4d);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(local_5d);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_30,(long)iVar1,&local_48,local_5d);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=(&this->map,&local_30);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_30);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(local_5d);
  std::vector<int,_std::allocator<int>_>::~vector(&local_48);
  std::allocator<int>::~allocator(&local_4d);
  return;
}

Assistant:

Map::Map(int w, int h)
{
    n = h;
    m = w;
    n = (n > 0 ? n : 0);
    m = (m > 0 ? m : 0);
    this->map = std::vector<std::vector<int>>(n, std::vector<int>(m, 0));
}